

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

int __thiscall HydEngine::open(HydEngine *this,char *__file,int __oflag,...)

{
  int iVar1;
  MatrixSolver *pMVar2;
  HydSolver *pHVar3;
  SystemError *this_00;
  string local_58;
  string local_38;
  
  if (this->engineState != CLOSED) {
    close(this,(int)__file);
  }
  this->network = (Network *)__file;
  Network::createHeadLossModel((Network *)__file);
  Network::createDemandModel(this->network);
  Network::createLeakageModel(this->network);
  std::__cxx11::string::string
            ((string *)&local_58,(string *)((this->network->options).stringOptions + 9));
  pMVar2 = MatrixSolver::factory(&local_58,(ostream *)&this->network->msgLog);
  this->matrixSolver = pMVar2;
  std::__cxx11::string::~string((string *)&local_58);
  if (this->matrixSolver == (MatrixSolver *)0x0) {
    this_00 = (SystemError *)__cxa_allocate_exception(0x30);
    SystemError::SystemError(this_00,6);
  }
  else {
    initMatrixSolver(this);
    std::__cxx11::string::string
              ((string *)&local_38,(string *)((this->network->options).stringOptions + 7));
    pHVar3 = HydSolver::factory(&local_38,this->network,this->matrixSolver);
    this->hydSolver = pHVar3;
    iVar1 = std::__cxx11::string::~string((string *)&local_38);
    if (this->hydSolver != (HydSolver *)0x0) {
      this->engineState = OPENED;
      return iVar1;
    }
    this_00 = (SystemError *)__cxa_allocate_exception(0x30);
    SystemError::SystemError(this_00,7);
  }
  __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
}

Assistant:

void HydEngine::open(Network* nw)
{
    // ... close a currently opened engine

    if (engineState != HydEngine::CLOSED) close();
    network = nw;

    // ... create hydraulic sub-models (can throw exception)

    network->createHeadLossModel();
    network->createDemandModel();
    network->createLeakageModel();

    // ... create and initialize a matrix solver

    matrixSolver = MatrixSolver::factory(
        network->option(Options::MATRIX_SOLVER), network->msgLog);
    if ( matrixSolver == nullptr )
    {
        throw SystemError(SystemError::MATRIX_SOLVER_NOT_OPENED);
    }
    initMatrixSolver();

    // ... create a hydraulic solver

    hydSolver = HydSolver::factory(
        network->option(Options::HYD_SOLVER), network, matrixSolver);
    if ( hydSolver == nullptr )
    {
        throw SystemError(SystemError::HYDRAULIC_SOLVER_NOT_OPENED);
    }
    engineState = HydEngine::OPENED;
}